

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_connection.cc
# Opt level: O2

bool __thiscall iqnet::ssl::Reaction_connection::reg_shutdown(Reaction_connection *this)

{
  bool bVar1;
  _func_int **pp_Var2;
  Reactor_base *pRVar3;
  undefined8 uStack_10;
  
  this->state = SHUTDOWN;
  bVar1 = Connection::shutdown_sent(&this->super_Connection);
  if (bVar1) {
    bVar1 = Connection::shutdown_recved(&this->super_Connection);
    if (bVar1) {
      this->state = EMPTY;
      return true;
    }
    pRVar3 = this->reactor;
    pp_Var2 = pRVar3->_vptr_Reactor_base;
    uStack_10 = 1;
  }
  else {
    pRVar3 = this->reactor;
    pp_Var2 = pRVar3->_vptr_Reactor_base;
    uStack_10 = 2;
  }
  (*pp_Var2[2])(pRVar3,this,uStack_10);
  return false;
}

Assistant:

bool ssl::Reaction_connection::reg_shutdown()
{
  state = SHUTDOWN;

  if( !shutdown_sent() )
  {
    reactor->register_handler( this, Reactor_base::OUTPUT );
  }
  else if( !shutdown_recved() )
  {
    reactor->register_handler( this, Reactor_base::INPUT );
  }
  else
  {
    state = EMPTY;
    return true;
  }

  return false;
}